

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O1

double __thiscall Spaghetti<RemSP>::Alloc(Spaghetti<RemSP> *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  int *piVar5;
  Mat1i *pMVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Mat local_70 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  iVar3 = *(int *)&pMVar4->field_0xc;
  dVar8 = RemSP::Alloc(((iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1) *
                       ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1,
                       &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  lVar7 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar7;
  piVar5 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_70,*piVar5,piVar5[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_70);
  cv::Mat::~Mat(local_70);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  lVar7 = cv::getTickCount();
  dVar10 = (double)lVar7 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar10;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar10;
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  lVar7 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar7;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar6->field_0x10,0,*(long *)&pMVar6->field_0x20 - *(long *)&pMVar6->field_0x18
        );
  lVar7 = cv::getTickCount();
  dVar9 = (double)lVar7 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar9;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar9;
  return dVar8 + ((dVar10 * 1000.0) / dVar1 -
                 (dVar9 * 1000.0) /
                 (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                 tick_frequency_);
}

Assistant:

double Alloc()
	{
		// Memory allocation of the labels solver
		double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);
		// Memory allocation for the output image
		perf_.start();
		img_labels_ = cv::Mat1i(img_.size());
		memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
		perf_.stop();
		double t = perf_.last();
		perf_.start();
		memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
		perf_.stop();
		double ma_t = t - perf_.last();
		// Return total time
		return ls_t + ma_t;
	}